

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::Reserve(RepeatedField<bool> *this,int new_size)

{
  bool is_soo;
  int iVar1;
  bool was_soo;
  int new_size_local;
  RepeatedField<bool> *this_local;
  
  is_soo = RepeatedField<bool>::is_soo(this);
  iVar1 = Capacity(this,is_soo);
  if (iVar1 < new_size) {
    iVar1 = size(this,is_soo);
    Grow(this,is_soo,iVar1,new_size);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  const bool was_soo = is_soo();
  if (ABSL_PREDICT_FALSE(new_size > Capacity(was_soo))) {
    Grow(was_soo, size(was_soo), new_size);
  }
}